

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O0

UnitQuaternion * composeQuaternion(UnitQuaternion *q1,UnitQuaternion *q2)

{
  Vector3 a;
  double *pdVar1;
  UnitQuaternion *in_RDI;
  double dVar2;
  double dVar3;
  Vector3 imagOut;
  Vector3 v2;
  double s2;
  Vector3 v1;
  double s1;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffd98;
  Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffda0;
  Vector3 *in_stack_fffffffffffffdb0;
  VectorFixSize<3U> *in_stack_fffffffffffffdb8;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffdc0;
  double dVar4;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
  *in_stack_fffffffffffffdc8;
  double in_stack_fffffffffffffdd0;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffde8;
  UnitQuaternion *a_00;
  VectorFixSize<3U> local_68 [2];
  double local_38;
  double local_18;
  
  a_00 = in_RDI;
  local_18 = realPartOfQuaternion((UnitQuaternion *)0x60b35e);
  imaginaryPartOfQuaternion((UnitQuaternion *)in_stack_fffffffffffffdc0);
  local_38 = realPartOfQuaternion((UnitQuaternion *)0x60b389);
  imaginaryPartOfQuaternion((UnitQuaternion *)in_stack_fffffffffffffdc0);
  iDynTree::VectorFixSize<3U>::VectorFixSize(local_68);
  iDynTree::toEigen<3U>(in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffde8,in_RDI->m_data);
  iDynTree::toEigen<3U>(in_stack_fffffffffffffdb8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator*
            (in_stack_fffffffffffffde8,in_RDI->m_data);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)in_stack_fffffffffffffdc8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
               *)in_stack_fffffffffffffdc0);
  crossVector((Vector3 *)a_00,(Vector3 *)in_stack_fffffffffffffde8);
  iDynTree::toEigen<3U>(in_stack_fffffffffffffdb8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
  ::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  iDynTree::toEigen<3U>(in_stack_fffffffffffffdb8);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  iDynTree::VectorFixSize<4U>::VectorFixSize(in_RDI);
  a.m_data[1] = (double)in_stack_fffffffffffffdc8;
  a.m_data[0] = local_18;
  a.m_data[2] = in_stack_fffffffffffffdd0;
  dVar3 = local_38;
  dVar4 = local_18;
  dVar2 = innerProduct(a,in_stack_fffffffffffffdb0);
  dVar3 = dVar4 * dVar3 + -dVar2;
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,0);
  *pdVar1 = dVar3;
  pdVar1 = iDynTree::VectorFixSize<3U>::operator()(local_68,0);
  dVar3 = *pdVar1;
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,1);
  *pdVar1 = dVar3;
  pdVar1 = iDynTree::VectorFixSize<3U>::operator()(local_68,1);
  dVar3 = *pdVar1;
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,2);
  *pdVar1 = dVar3;
  pdVar1 = iDynTree::VectorFixSize<3U>::operator()(local_68,2);
  dVar3 = *pdVar1;
  pdVar1 = iDynTree::VectorFixSize<4U>::operator()(in_RDI,3);
  *pdVar1 = dVar3;
  return a_00;
}

Assistant:

iDynTree::UnitQuaternion composeQuaternion(const iDynTree::UnitQuaternion &q1, const iDynTree::UnitQuaternion &q2)
{
    using iDynTree::toEigen;

    double s1 = realPartOfQuaternion(q1);
    iDynTree::Vector3 v1 = imaginaryPartOfQuaternion(q1);

    double s2 = realPartOfQuaternion(q2);
    iDynTree::Vector3 v2 = imaginaryPartOfQuaternion(q2);

    iDynTree::Vector3 imagOut;
    toEigen(imagOut) = toEigen(v2)*s1 + toEigen(v1)*s2 + toEigen(crossVector(v1, v2)); // to be read as imagOut = v2*s1 + v1*s2 + crossVector(v1, v2)

    iDynTree::UnitQuaternion out;
    out(0) = s1*s2 - innerProduct(v1, v2);
    out(1) = imagOut(0);
    out(2) = imagOut(1);
    out(3) = imagOut(2);

    return out;
}